

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tun_linux.c
# Opt level: O0

int ev_linux_opentun(ev_impl *impl,tun_param param)

{
  _Bool _Var1;
  int *unaff_retaddr;
  char *in_stack_00000008;
  int fd;
  int ifindex;
  in_addr in_stack_00000020;
  int local_4;
  
  local_4 = open("/dev/net/tun",2);
  if (local_4 != -1) {
    _Var1 = if_settun(fd,in_stack_00000008,unaff_retaddr);
    if (_Var1) {
      _Var1 = if_setaddr((char *)impl,in_stack_00000020);
      if (_Var1) {
        _Var1 = if_setnetmask((char *)impl,in_stack_00000020);
        if (_Var1) {
          _Var1 = if_up(in_stack_00000008);
          if (!_Var1) {
            perror("if_up()");
            close(local_4);
            local_4 = -1;
          }
        }
        else {
          perror("if_setnetmask()");
          close(local_4);
          local_4 = -1;
        }
      }
      else {
        perror("if_setaddr()");
        close(local_4);
        local_4 = -1;
      }
    }
    else {
      perror("if_settun()");
      close(local_4);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int ev_linux_opentun(struct ev_impl * impl, struct tun_param param)
{
  int ifindex = -1;
  int fd = -1;
  fd = open("/dev/net/tun", O_RDWR);
  if(fd != -1)
  {
    if(!if_settun(fd, param.ifname, &ifindex))
    {
      perror("if_settun()");
      close(fd);
      return -1;
    }
    if(!if_setaddr(param.ifname, param.addr))
    {
      perror("if_setaddr()");
      close(fd);
      return -1;
    }
    if(!if_setnetmask(param.ifname, param.netmask))
    {
      perror("if_setnetmask()");
      close(fd);
      return -1;
    }
    if(!if_up(param.ifname))
    {
      perror("if_up()");
      close(fd);
      return -1;
    }
  }
  return fd;
}